

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O3

string * __thiscall llvm::Twine::str_abi_cxx11_(string *__return_storage_ptr__,Twine *this)

{
  uint *puVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  char *pcVar4;
  NodeKind NVar5;
  StringRef SVar6;
  undefined1 local_128 [8];
  SmallString<256U> Vec;
  
  NVar5 = this->RHSKind ^ EmptyKind;
  if (this->LHSKind == StdStringKind && NVar5 == NullKind) {
    puVar2 = (this->LHS).decUL;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    uVar3 = *puVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,uVar3,puVar2[1] + uVar3);
  }
  else if (this->LHSKind == FormatvObjectKind && NVar5 == NullKind) {
    formatv_object_base::str_abi_cxx11_(__return_storage_ptr__,(this->LHS).formatvObject);
  }
  else {
    puVar1 = &Vec.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
    Vec.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = (void *)0x10000000000;
    local_128 = (undefined1  [8])puVar1;
    SVar6 = toStringRef(this,(SmallVectorImpl<char> *)local_128);
    pcVar4 = SVar6.Data;
    if (pcVar4 == (char *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar4,pcVar4 + SVar6.Length);
    }
    if (local_128 != (undefined1  [8])puVar1) {
      free((void *)local_128);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Twine::str() const {
  // If we're storing only a std::string, just return it.
  if (LHSKind == StdStringKind && RHSKind == EmptyKind)
    return *LHS.stdString;

  // If we're storing a formatv_object, we can avoid an extra copy by formatting
  // it immediately and returning the result.
  if (LHSKind == FormatvObjectKind && RHSKind == EmptyKind)
    return LHS.formatvObject->str();

  // Otherwise, flatten and copy the contents first.
  SmallString<256> Vec;
  return toStringRef(Vec).str();
}